

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

int __thiscall leveldb::RecoveryTest::NumTables(RecoveryTest *this)

{
  size_type sVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  RecoveryTest *local_10;
  RecoveryTest *this_local;
  
  local_10 = this;
  GetFiles(&local_28,this,kTableFile);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_28);
  return (int)sVar1;
}

Assistant:

int NumTables() { return GetFiles(kTableFile).size(); }